

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

ALLEGRO_EVENT * get_next_event_if_any(ALLEGRO_EVENT_QUEUE *queue,_Bool delete)

{
  ALLEGRO_EVENT *pAVar1;
  
  if (queue->events_head == queue->events_tail) {
    pAVar1 = (ALLEGRO_EVENT *)0x0;
  }
  else {
    pAVar1 = (ALLEGRO_EVENT *)_al_vector_ref(&queue->events,queue->events_tail);
    if (delete) {
      queue->events_tail = (uint)((ulong)(queue->events_tail + 1) % (queue->events)._size);
    }
  }
  return pAVar1;
}

Assistant:

static ALLEGRO_EVENT *get_next_event_if_any(ALLEGRO_EVENT_QUEUE *queue,
   bool delete)
{
   ALLEGRO_EVENT *event;

   if (is_event_queue_empty(queue)) {
      return NULL;
   }

   event = _al_vector_ref(&queue->events, queue->events_tail);
   if (delete) {
      queue->events_tail = circ_array_next(&queue->events, queue->events_tail);
   }
   return event;
}